

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall
slang::parsing::Lexer::scanDisabledRegion
          (Lexer *this,string_view firstWord,string_view secondWord,
          optional<std::basic_string_view<char,_std::char_traits<char>_>_> thirdWord,
          DiagCode unclosedDiag)

{
  size_type *psVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  Diagnostic *this_00;
  anon_class_8_1_8991fb9c matchWord;
  anon_class_8_1_8991fb9c local_38;
  
  local_38.this = this;
  do {
    do {
      while( true ) {
        pcVar3 = this->sourceBuffer;
        cVar2 = *pcVar3;
        if (cVar2 != '\0') break;
        if (this->sourceEnd + -1 <= pcVar3) {
          this_00 = addDiag(this,unclosedDiag,
                            (long)pcVar3 -
                            (long)(this->originalBegin + (uint)((int)pcVar3 - *(int *)&this->marker)
                                  ));
          if (unclosedDiag != (DiagCode)0x100002) {
            return;
          }
          Diagnostic::operator<<(this_00,secondWord);
          return;
        }
        this->sourceBuffer = pcVar3 + 1;
      }
      this->sourceBuffer = pcVar3 + 1;
    } while ((cVar2 != '/') || ((cVar2 = pcVar3[1], cVar2 != '/' && (cVar2 != '*'))));
    this->sourceBuffer = pcVar3 + 2;
    bVar4 = scanDisabledRegion::anon_class_8_1_8991fb9c::operator()(&local_38,firstWord);
  } while ((!bVar4) ||
          ((bVar4 = scanDisabledRegion::anon_class_8_1_8991fb9c::operator()(&local_38,secondWord),
           !bVar4 || ((((undefined1  [24])
                        thirdWord.
                        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       & (undefined1  [24])0x1) != (undefined1  [24])0x0 &&
                      (bVar4 = scanDisabledRegion::anon_class_8_1_8991fb9c::operator()
                                         (&local_38,
                                          thirdWord.
                                          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                          ._M_payload.
                                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                          ._M_payload._M_value), !bVar4))))));
  if (cVar2 == '*') {
    scanBlockComment(this);
  }
  else {
    scanLineComment(this);
  }
  psVar1 = &(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.len;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void Lexer::scanDisabledRegion(std::string_view firstWord, std::string_view secondWord,
                               std::optional<std::string_view> thirdWord, DiagCode unclosedDiag) {
    auto matchWord = [&](std::string_view word) {
        while (isTabOrSpace(peek()))
            advance();

        for (char c : word) {
            if (!consume(c))
                return false;
        }

        char c = peek();
        return isWhitespace(c) || c == '\0';
    };

    while (true) {
        char c = peek();
        if (c == '\0' && reallyAtEnd()) {
            auto& diag = addDiag(unclosedDiag, currentOffset() - lexemeLength());
            if (unclosedDiag == diag::UnclosedTranslateOff)
                diag << secondWord;
            return;
        }

        advance();
        if (c == '/' && (peek() == '/' || peek() == '*')) {
            const bool isBlockComment = peek() == '*';
            advance();

            if (matchWord(firstWord) && matchWord(secondWord)) {
                if (!thirdWord || matchWord(*thirdWord)) {
                    // Scan the rest of the comment and then return.
                    // We discard the comment trivia from the buffer
                    // so that this part of the region ends up as
                    // a DisabledText trivia instead.
                    if (isBlockComment)
                        scanBlockComment();
                    else
                        scanLineComment();
                    triviaBuffer.pop_back();
                    return;
                }
            }
        }
    }
}